

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFiltersExport.cpp
# Opt level: O2

HelicsFilter
helicsFederateRegisterGlobalFilter
          (HelicsFederate fed,HelicsFilterTypes type,char *name,HelicsError *err)

{
  Filter *pFVar1;
  HelicsFilter pvVar2;
  char *in_R9;
  string_view name_00;
  allocator<char> local_69;
  __single_object filt;
  unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_> local_60;
  shared_ptr<helics::Federate> fedObj;
  size_t local_48;
  Federate *local_40;
  
  getFedSharedPtr(&fedObj,(HelicsError *)fed);
  if (fedObj.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    pvVar2 = (HelicsFilter)0x0;
  }
  else {
    std::make_unique<helics::FilterObject>();
    if (name == (char *)0x0) {
      std::__cxx11::string::string((string *)&local_48,&gHelicsEmptyStr_abi_cxx11_);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,name,&local_69);
    }
    name_00._M_str = in_R9;
    name_00._M_len = local_48;
    pFVar1 = helics::make_filter((helics *)0x1,type,
                                 (FilterTypes)
                                 fedObj.
                                 super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr,local_40,name_00);
    *(Filter **)
     ((long)filt._M_t.
            super___uniq_ptr_impl<helics::FilterObject,_std::default_delete<helics::FilterObject>_>.
            _M_t.
            super__Tuple_impl<0UL,_helics::FilterObject_*,_std::default_delete<helics::FilterObject>_>
            .super__Head_base<0UL,_helics::FilterObject_*,_false>._M_head_impl + 8) = pFVar1;
    std::__cxx11::string::~string((string *)&local_48);
    std::__shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)filt._M_t.
                      super___uniq_ptr_impl<helics::FilterObject,_std::default_delete<helics::FilterObject>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_helics::FilterObject_*,_std::default_delete<helics::FilterObject>_>
                      .super__Head_base<0UL,_helics::FilterObject_*,_false>._M_head_impl + 0x18),
               &fedObj.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>);
    *(bool *)((long)filt._M_t.
                    super___uniq_ptr_impl<helics::FilterObject,_std::default_delete<helics::FilterObject>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_helics::FilterObject_*,_std::default_delete<helics::FilterObject>_>
                    .super__Head_base<0UL,_helics::FilterObject_*,_false>._M_head_impl + 1) =
         type == HELICS_FILTER_TYPE_CUSTOM;
    local_60._M_t.
    super___uniq_ptr_impl<helics::FilterObject,_std::default_delete<helics::FilterObject>_>._M_t.
    super__Tuple_impl<0UL,_helics::FilterObject_*,_std::default_delete<helics::FilterObject>_>.
    super__Head_base<0UL,_helics::FilterObject_*,_false>._M_head_impl =
         filt._M_t.
         super___uniq_ptr_impl<helics::FilterObject,_std::default_delete<helics::FilterObject>_>.
         _M_t.
         super__Tuple_impl<0UL,_helics::FilterObject_*,_std::default_delete<helics::FilterObject>_>.
         super__Head_base<0UL,_helics::FilterObject_*,_false>._M_head_impl;
    filt._M_t.
    super___uniq_ptr_impl<helics::FilterObject,_std::default_delete<helics::FilterObject>_>._M_t.
    super__Tuple_impl<0UL,_helics::FilterObject_*,_std::default_delete<helics::FilterObject>_>.
    super__Head_base<0UL,_helics::FilterObject_*,_false>._M_head_impl =
         (__uniq_ptr_data<helics::FilterObject,_std::default_delete<helics::FilterObject>,_true,_true>
          )(__uniq_ptr_impl<helics::FilterObject,_std::default_delete<helics::FilterObject>_>)0x0;
    pvVar2 = anon_unknown.dwarf_a089a::federateAddFilter(fed,&local_60);
    std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>::~unique_ptr
              (&local_60);
    std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>::~unique_ptr
              (&filt);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&fedObj.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return pvVar2;
}

Assistant:

HelicsFilter helicsFederateRegisterGlobalFilter(HelicsFederate fed, HelicsFilterTypes type, const char* name, HelicsError* err)
{
    auto fedObj = getFedSharedPtr(fed, err);
    if (!fedObj) {
        return nullptr;
    }

    try {
        auto filt = std::make_unique<helics::FilterObject>();
        filt->filtPtr = &helics::make_filter(helics::InterfaceVisibility::GLOBAL,
                                             static_cast<helics::FilterTypes>(type),
                                             fedObj.get(),
                                             AS_STRING(name));
        filt->fedptr = std::move(fedObj);
        filt->custom = (type == HELICS_FILTER_TYPE_CUSTOM);
        return federateAddFilter(fed, std::move(filt));
    }
    catch (...) {
        helicsErrorHandler(err);
    }
    return nullptr;
}